

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O3

bool __thiscall testing::internal::FilePath::CreateDirectoriesRecursively(FilePath *this)

{
  char *__file;
  size_t sVar1;
  int iVar2;
  FilePath *path;
  bool bVar3;
  FilePath parent;
  FilePath local_b8;
  stat local_a8;
  
  __file = (this->pathname_).c_str_;
  sVar1 = (this->pathname_).length_;
  if (__file == (char *)0x0 || sVar1 != 0) {
    bVar3 = __file[sVar1 - 1] == '/';
    if (bVar3 && sVar1 != 0) {
      iVar2 = stat(__file,&local_a8);
      if ((iVar2 != 0) || (bVar3 = true, (local_a8.st_mode & 0xf000) != 0x4000)) {
        RemoveTrailingPathSeparator(&local_b8);
        RemoveFileName((FilePath *)&local_a8);
        if (local_b8.pathname_.c_str_ != (char *)0x0) {
          operator_delete__(local_b8.pathname_.c_str_);
        }
        bVar3 = CreateDirectoriesRecursively((FilePath *)&local_a8);
        if (bVar3) {
          bVar3 = CreateFolder(this);
        }
        else {
          bVar3 = false;
        }
        if ((void *)local_a8.st_dev != (void *)0x0) {
          operator_delete__((void *)local_a8.st_dev);
        }
      }
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool FilePath::CreateDirectoriesRecursively() const {
  if (!this->IsDirectory()) {
    return false;
  }

  if (pathname_.length() == 0 || this->DirectoryExists()) {
    return true;
  }

  const FilePath parent(this->RemoveTrailingPathSeparator().RemoveFileName());
  return parent.CreateDirectoriesRecursively() && this->CreateFolder();
}